

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O0

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  ulong local_88;
  size_t i;
  size_t j;
  char *newp;
  size_t len;
  ssize_t k;
  ssize_t amount;
  char *sel_org;
  char *sel;
  char *path;
  curl_off_t *bytecount;
  Curl_easy *pCStack_30;
  curl_socket_t sockfd;
  Curl_easy *data;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pCStack_30 = conn->data;
  bytecount._4_4_ = conn->sock[0];
  path = (char *)&(pCStack_30->req).bytecount;
  sel = (pCStack_30->state).path;
  sel_org = (char *)0x0;
  amount = 0;
  *done = true;
  p_Stack_20 = done;
  done_local = (_Bool *)conn;
  sVar3 = strlen(sel);
  if (sVar3 < 3) {
    sel_org = "";
    sVar3 = strlen("");
    newp = (char *)(long)(int)sVar3;
  }
  else {
    __s = sel + 2;
    sVar3 = strlen(__s);
    for (local_88 = 0; local_88 < sVar3; local_88 = local_88 + 1) {
      if (__s[local_88] == '?') {
        __s[local_88] = '\t';
      }
    }
    CVar1 = Curl_urldecode(pCStack_30,__s,0,&sel_org,(size_t *)&newp,false);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    amount = (ssize_t)sel_org;
    data._4_4_ = CURLE_OK;
  }
  len = curlx_uztosz((size_t)newp);
  do {
    data._4_4_ = Curl_write((connectdata *)done_local,bytecount._4_4_,sel_org,len,&k);
    if ((data._4_4_ != CURLE_OK) ||
       (data._4_4_ = Curl_client_write((connectdata *)done_local,2,sel_org,k),
       data._4_4_ != CURLE_OK)) goto LAB_0015795e;
    len = len - k;
    sel_org = sel_org + k;
    if ((long)len < 1) goto LAB_0015795e;
    iVar2 = Curl_socket_check(-1,-1,bytecount._4_4_,100);
  } while (-1 < iVar2);
  data._4_4_ = CURLE_SEND_ERROR;
LAB_0015795e:
  (*Curl_cfree)((void *)amount);
  if (data._4_4_ == CURLE_OK) {
    data._4_4_ = Curl_sendf(bytecount._4_4_,(connectdata *)done_local,"\r\n");
  }
  if (data._4_4_ == CURLE_OK) {
    data._4_4_ = Curl_client_write((connectdata *)done_local,2,"\r\n",2);
    conn_local._4_4_ = data._4_4_;
    if (data._4_4_ == CURLE_OK) {
      Curl_setup_transfer((connectdata *)done_local,0,-1,false,(curl_off_t *)path,-1,
                          (curl_off_t *)0x0);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    Curl_failf(pCStack_30,"Failed sending Gopher request");
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  curl_off_t *bytecount = &data->req.bytecount;
  char *path = data->state.path;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(path) <= 2) {
    sel = (char *)"";
    len = (int)strlen(sel);
  }
  else {
    char *newp;
    size_t j, i;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = path;
    newp += 2;

    /* ... then turn ? into TAB for search servers, Veronica, etc. ... */
    j = strlen(newp);
    for(i = 0; i<j; i++)
      if(newp[i] == '?')
        newp[i] = '\x09';

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                      -1, NULL); /* no upload */
  return CURLE_OK;
}